

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcollator.cpp
# Opt level: O0

void __thiscall QCollator::QCollator(QCollator *this,QCollator *other)

{
  QCollatorPrivate *in_RSI;
  long *in_RDI;
  
  *in_RDI = *(long *)in_RSI;
  if (*in_RDI != 0) {
    QCollatorPrivate::ensureInitialized(in_RSI);
    QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)in_RSI);
  }
  return;
}

Assistant:

QCollator::QCollator(const QCollator &other)
    : d(other.d)
{
    if (d) {
        // Ensure clean, lest both copies try to init() at the same time:
        d->ensureInitialized();
        d->ref.ref();
    }
}